

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

bool __thiscall QTest::WatchDog::waitFor(WatchDog *this,unique_lock<std::mutex> *m,Expectation e)

{
  bool bVar1;
  int iVar2;
  Expectation EVar3;
  long in_FS_OFFSET;
  anon_class_16_2_fd512dd2 __p;
  bool ok;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)e & 3) == 2) {
    if (timeout == -1) {
      local_40.__r = local_40.__r & 0xffffffffffffff00;
      iVar2 = qEnvironmentVariableIntValue("QTEST_FUNCTION_TIMEOUT",(bool *)&local_40);
      timeout = 300000;
      if ((char)local_40.__r != '\0') {
        timeout = iVar2;
      }
      if (iVar2 < 1) {
        timeout = 300000;
      }
    }
    local_40.__r = (rep)timeout;
    __p.e = e;
    __p.this = this;
    bVar1 = std::condition_variable::
            wait_for<long,std::ratio<1l,1000l>,QTest::WatchDog::waitFor(std::unique_lock<std::mutex>&,QTest::WatchDog::Expectation)::_lambda()_1_>
                      (&this->waitCondition,m,&local_40,__p);
  }
  else {
    bVar1 = true;
    EVar3 = (this->expecting)._M_i;
    while (EVar3 == e) {
      std::condition_variable::wait((unique_lock *)&this->waitCondition);
      EVar3 = (this->expecting)._M_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool waitFor(std::unique_lock<std::mutex> &m, Expectation e)
    {
        auto expectationChanged = [this, e] { return expecting.load(std::memory_order_relaxed) != e; };
        switch (state(e)) {
        case TestFunctionEnd:
            return waitCondition.wait_for(m, defaultTimeout(), expectationChanged);
        case ThreadStart:
        case ThreadEnd:
        case TestFunctionStart:
            waitCondition.wait(m, expectationChanged);
            return true;
        }
        Q_UNREACHABLE_RETURN(false);
    }